

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<10,_10,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  undefined1 *puVar2;
  float *pfVar3;
  long lVar4;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar11;
  undefined4 uVar12;
  Type in0;
  float afStack_c8 [6];
  float local_b0 [2];
  ulong local_a8;
  undefined4 local_a0;
  undefined8 local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined4 local_80;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  undefined1 local_58 [4];
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long lVar10;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &local_28;
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      auVar8 = _DAT_00ac4b30;
      do {
        bVar11 = SUB164(auVar8 ^ _DAT_00ac4b80,4) == -0x80000000 &&
                 SUB164(auVar8 ^ _DAT_00ac4b80,0) < -0x7ffffffd;
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar4 != lVar7) {
            uVar12 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar7 + -0x10) = uVar12;
        }
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar4 + -0x10 != lVar7) {
            uVar12 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar7) = uVar12;
        }
        lVar10 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar10 + 2;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0x40);
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x10;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
    } while (lVar6 != 4);
    local_38 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_30 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_28 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_20 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_18 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_10 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    puVar1 = &local_38;
    local_18 = 0;
    uStack_10 = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    puVar5 = &sr::(anonymous_namespace)::s_constInMat3x4;
    lVar4 = 0;
    do {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar6 * 4) = *(undefined4 *)((long)puVar5 + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0xc);
      lVar4 = lVar4 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar5 = puVar5 + 3;
    } while (lVar4 != 4);
  }
  puVar2 = local_58;
  local_48 = 0;
  uStack_40 = 0;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  stack0xffffffffffffffa0 = 0;
  lVar4 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    auVar9 = _DAT_00ac4b30;
    do {
      bVar11 = SUB164(auVar9 ^ _DAT_00ac4b80,4) == -0x80000000 &&
               SUB164(auVar9 ^ _DAT_00ac4b80,0) < -0x7ffffffd;
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar4 != lVar7) {
          uVar12 = 0;
        }
        *(undefined4 *)(puVar2 + lVar7 + -0x10) = uVar12;
      }
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar4 + -0x10 != lVar7) {
          uVar12 = 0;
        }
        *(undefined4 *)(puVar2 + lVar7) = uVar12;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x40);
    lVar6 = lVar6 + 1;
    lVar4 = lVar4 + 0x10;
    puVar2 = puVar2 + 4;
  } while (lVar6 != 4);
  pfVar3 = res.m_data;
  puVar1 = &local_38;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      *(uint *)((long)pfVar3 + lVar6) = *(uint *)((long)puVar1 + lVar6) ^ (uint)DAT_00ac4b80;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x30);
    lVar4 = lVar4 + 1;
    pfVar3 = pfVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
  } while (lVar4 != 4);
  res_1.m_data[0] = res.m_data[0];
  res_1.m_data[1] = res.m_data[1];
  res_1.m_data[2] = res.m_data[2];
  local_88 = CONCAT44(uStack_50,uStack_54);
  local_80 = uStack_4c;
  local_b0[0] = 0.0;
  local_b0[1] = 0.0;
  local_a8 = local_a8 & 0xffffffff00000000;
  lVar4 = 0;
  do {
    local_b0[lVar4] = res_1.m_data[lVar4] + *(float *)((long)&local_88 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_98 = uStack_40;
  local_90 = (undefined4)local_48;
  afStack_c8[2] = 0.0;
  afStack_c8[3] = 0.0;
  afStack_c8[4] = 0.0;
  lVar4 = 0;
  do {
    afStack_c8[lVar4 + 2] = local_b0[lVar4] + *(float *)((long)&local_98 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_a8 = 0x100000000;
  local_a0 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)local_b0[lVar4]] = afStack_c8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}